

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,ImageClearingTestInstance *this,string *successMessage
          ,UVec4 *clearCoords)

{
  float fVar1;
  ConstPixelBufferAccess *this_00;
  pointer pPVar2;
  VkExtent3D VVar3;
  bool bVar4;
  bool bVar5;
  int ndx;
  TextureChannelClass TVar6;
  int iVar7;
  long lVar8;
  ostream *poVar9;
  uint uVar10;
  ChannelOrder CVar11;
  UVec4 *pUVar12;
  ChannelOrder CVar13;
  deUint32 dVar14;
  uint uVar15;
  TestParams_conflict *pTVar16;
  VkClearDepthStencilValue *pVVar17;
  VkFormat format_00;
  int iVar18;
  stringstream *this_01;
  ImageClearingTestInstance *pIVar19;
  ImageClearingTestInstance *pIVar20;
  UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *this_02;
  deUint32 x;
  string *description;
  TextureFormat *pTVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  VkExtent3D VVar27;
  VkExtent3D VVar28;
  BVec4 channelMask;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image;
  TextureFormat format;
  Vec4 threshold;
  IVec4 mantissaBits;
  string message;
  Vector<int,_4> local_238 [2];
  string *local_218;
  UVec4 *local_210;
  TextureFormat format_1;
  Vector<float,_4> local_1f8;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image_2;
  uint local_1d0;
  DeviceInterface *local_1c0;
  stringstream s;
  int iStack_1b4;
  VkAllocationCallbacks *pVStack_1b0;
  ostream local_1a8 [376];
  
  this_01 = &s;
  pUVar12 = clearCoords;
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this_01);
  local_210 = clearCoords;
  bVar4 = tcu::Vector<unsigned_int,_4>::operator!=(clearCoords,(Vector<unsigned_int,_4> *)this_01);
  format_00 = (VkFormat)this_01;
  bVar5 = getIsDepthFormat((ImageClearingTestInstance *)(ulong)this->m_params->imageFormat,format_00
                          );
  local_218 = successMessage;
  if (bVar5) {
    pIVar19 = this;
    readImage(&image,this,2);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    pTVar16 = this->m_params;
    for (dVar14 = 0; format_00 = (VkFormat)pIVar19, dVar14 < (pTVar16->imageExtent).height;
        dVar14 = dVar14 + 1) {
      pIVar20 = (ImageClearingTestInstance *)0x0;
      while (uVar15 = (uint)pIVar20, uVar15 < (pTVar16->imageExtent).width) {
        lVar8 = 0x28;
        if (bVar4) {
          bVar5 = isInClearRange(local_210,uVar15,dVar14);
          lVar8 = (ulong)bVar5 * 0x10 + 0x18;
        }
        fVar1 = *(float *)((long)pTVar16->clearValue + lVar8 + -0x28);
        this_00 = *(ConstPixelBufferAccess **)
                   (CONCAT44(image.
                             super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                             .m_data.ptr._4_4_,
                             (int)image.
                                  super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                  .m_data.ptr) + 0x20);
        format = tcu::getEffectiveDepthStencilTextureFormat(&this_00->m_format,MODE_DEPTH);
        TVar6 = tcu::getTextureChannelClass(format.type);
        if (TVar6 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
          tcu::getTextureFormatBitDepth((tcu *)&s,&format);
          uVar22 = _s;
          fVar24 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar15,dVar14,0);
          fVar26 = 2.0 / (float)~(-1 << ((byte)uVar22 & 0x1f));
          fVar25 = fVar24 - fVar1;
          uVar23 = -(uint)(-fVar25 <= fVar25);
          if (fVar26 < (float)(~uVar23 & (uint)-fVar25 | (uint)fVar25 & uVar23)) {
            std::__cxx11::stringstream::stringstream((stringstream *)&s);
            poVar9 = std::operator<<(local_1a8,"Ref:");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar1);
            poVar9 = std::operator<<(poVar9," Threshold:");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar26);
            poVar9 = std::operator<<(poVar9," Depth:");
            std::ostream::operator<<(poVar9,fVar24);
            std::__cxx11::stringbuf::str();
LAB_004cd7dd:
            std::__cxx11::string::operator=((string *)&message,(string *)local_238);
            std::__cxx11::string::~string((string *)local_238);
            std::__cxx11::stringstream::~stringstream((stringstream *)&s);
LAB_004cd807:
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                           "Depth value mismatch! ",&message);
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)&s);
            goto LAB_004cd9d2;
          }
        }
        else {
          if (TVar6 != TEXTURECHANNELCLASS_FLOATING_POINT) goto LAB_004cd807;
          fVar26 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar15,dVar14,0);
          pIVar20 = (ImageClearingTestInstance *)&format;
          tcu::getTextureFormatMantissaBitDepth((tcu *)&s,&format);
          fVar24 = ABS(fVar26);
          fVar25 = ABS(fVar1);
          iVar18 = (int)fVar24 - (int)fVar25;
          if ((uint)fVar24 < (uint)fVar25) {
            iVar18 = -((int)fVar24 - (int)fVar25);
          }
          uVar22 = CONCAT31((int3)((uint)fVar25 >> 8),0x17U - (char)s);
          fVar24 = (float)(10 << (0x17U - (char)s & 0x1f));
          if ((int)fVar24 < iVar18) {
            std::__cxx11::stringstream::stringstream((stringstream *)&s);
            poVar9 = std::operator<<(local_1a8,"Ref:");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar1);
            poVar9 = std::operator<<(poVar9," Threshold:");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,fVar24);
            poVar9 = std::operator<<(poVar9," Depth:");
            std::ostream::operator<<(poVar9,fVar26);
            std::__cxx11::stringbuf::str();
            goto LAB_004cd7dd;
          }
        }
        pUVar12 = (UVec4 *)(ulong)uVar22;
        pTVar16 = this->m_params;
        pIVar19 = pIVar20;
        pIVar20 = (ImageClearingTestInstance *)(ulong)(uVar15 + 1);
      }
    }
    std::__cxx11::string::~string((string *)&message);
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::~UniqueBase(&image.
                   super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                 );
  }
  description = local_218;
  bVar5 = getIsStencilFormat((ImageClearingTestInstance *)(ulong)this->m_params->imageFormat,
                             format_00);
  if (bVar5) {
    readImage(&image,this,4);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    pTVar16 = this->m_params;
    for (uVar15 = 0; uVar15 < (pTVar16->imageExtent).height; uVar15 = uVar15 + 1) {
      uVar22 = 0;
      while (pTVar16 = this->m_params, uVar22 < (pTVar16->imageExtent).width) {
        lVar8 = 0x2c;
        if (bVar4) {
          bVar5 = isInClearRange(local_210,uVar22,uVar15);
          lVar8 = (ulong)bVar5 * 0x10 + 0x1c;
        }
        iVar18 = *(int *)((long)pTVar16->clearValue + lVar8 + -0x28);
        pUVar12 = (UVec4 *)0x0;
        iVar7 = tcu::ConstPixelBufferAccess::getPixStencil
                          (*(ConstPixelBufferAccess **)
                            (CONCAT44(image.
                                      super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                      .m_data.ptr._4_4_,
                                      (int)image.
                                           super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                           .m_data.ptr) + 0x20),uVar22,uVar15,0);
        uVar22 = uVar22 + 1;
        if (iVar7 != iVar18) {
          std::__cxx11::stringstream::stringstream((stringstream *)&s);
          poVar9 = std::operator<<(local_1a8,"Ref:");
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          poVar9 = std::operator<<(poVar9," Threshold:0");
          poVar9 = std::operator<<(poVar9," Stencil:");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&message,(string *)local_238);
          std::__cxx11::string::~string((string *)local_238);
          std::__cxx11::stringstream::~stringstream((stringstream *)&s);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                         "Stencil value mismatch! ",&message);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&s);
LAB_004cd9d2:
          std::__cxx11::string::~string((string *)&s);
          std::__cxx11::string::~string((string *)&message);
          this_02 = &image.
                     super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
          ;
LAB_004cd9ee:
          de::details::
          UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
          ~UniqueBase(this_02);
          return __return_storage_ptr__;
        }
      }
    }
    std::__cxx11::string::~string((string *)&message);
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::~UniqueBase(&image.
                   super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                 );
    description = local_218;
  }
  bVar5 = ::vk::isDepthStencilFormat(this->m_params->imageFormat);
  if (!bVar5) {
    readImage(&image_2,this,1);
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    for (uVar15 = 0; uVar15 < this->m_imageMipLevels; uVar15 = uVar15 + 1) {
      uVar22 = this->m_thresholdMipLevel;
      VVar27.height = 0;
      VVar27.width = (this->m_params->imageExtent).depth;
      VVar27.depth = uVar15;
      VVar28 = getMipLevelExtent(*(anon_unknown_0 **)&this->m_params->imageExtent,VVar27,
                                 (deUint32)pUVar12);
      VVar27 = VVar28;
      for (dVar14 = 0; dVar14 != VVar27.depth; dVar14 = dVar14 + 1) {
        for (uVar23 = 0; local_1d0 = VVar28.height, uVar23 != local_1d0; uVar23 = uVar23 + 1) {
          x = 0;
          while( true ) {
            local_1c0 = VVar27._0_8_;
            VVar3.depth = VVar28.depth;
            VVar3._0_8_ = local_1c0;
            local_1c0._0_4_ = VVar27.width;
            if (x == (deUint32)local_1c0) break;
            if (bVar4) {
              bVar5 = isInClearRange(local_210,x,uVar23);
              pTVar16 = this->m_params;
              if (bVar5) goto LAB_004cdb41;
              pVVar17 = (VkClearDepthStencilValue *)&pTVar16->initValue;
            }
            else {
              pTVar16 = this->m_params;
LAB_004cdb41:
              pVVar17 = (VkClearDepthStencilValue *)(pTVar16->clearValue + (uVar22 <= uVar15));
            }
            pPVar2 = ((image_2.
                       super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                       .m_data.ptr)->m_access).
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            format_1 = *(TextureFormat *)(pPVar2 + (int)uVar15);
            TVar6 = tcu::getTextureChannelClass(format_1.type);
            tcu::getTextureFormatChannelMask((tcu *)&channelMask,&format_1);
            if (TEXTURECHANNELCLASS_FLOATING_POINT < TVar6) {
LAB_004ce097:
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s
                             ,"Color value mismatch! ",&message);
              tcu::TestStatus::fail(__return_storage_ptr__,(string *)&s);
              std::__cxx11::string::~string((string *)&s);
              std::__cxx11::string::~string((string *)&message);
              this_02 = &image_2.
                         super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
              ;
              goto LAB_004cd9ee;
            }
            pTVar21 = (TextureFormat *)(pPVar2 + (int)uVar15);
            iVar18 = (int)pTVar21;
            switch(TVar6) {
            default:
              tcu::getTextureFormatBitDepth((tcu *)&image,&format_1);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&format,iVar18,x,uVar23);
              mantissaBits.m_data._0_8_ = *pVVar17;
              mantissaBits.m_data._8_8_ = pVVar17[1];
              bVar5 = TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
              threshold.m_data[0] = 1.0;
              if (0 < (int)image.
                           super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                           .m_data.ptr) {
                threshold.m_data[0] =
                     1.0 / ((float)(1 << ((char)(int)image.
                                                  super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                                  .m_data.ptr - bVar5 & 0x1fU)) + -1.0);
              }
              threshold.m_data[1] = 1.0;
              if (0 < image.
                      super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                      .m_data.ptr._4_4_) {
                threshold.m_data[1] =
                     1.0 / ((float)(1 << ((char)image.
                                                super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                                .m_data.ptr._4_4_ - bVar5 & 0x1fU)) + -1.0);
              }
              threshold.m_data[2] = 1.0;
              if (0 < (int)image.
                           super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                           .m_data._8_4_) {
                threshold.m_data[2] =
                     1.0 / ((float)(1 << (image.
                                          super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                          .m_data._8_1_ - bVar5 & 0x1fU)) + -1.0);
              }
              threshold.m_data[3] = 1.0;
              uVar10 = image.
                       super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                       .m_data._12_4_;
              if (0 < (int)image.
                           super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                           .m_data._12_4_) {
                uVar10 = image.
                         super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                         .m_data._12_4_ - (uint)bVar5;
                threshold.m_data[3] = 1.0 / ((float)(1 << ((byte)uVar10 & 0x1f)) + -1.0);
              }
              pUVar12 = (UVec4 *)(ulong)uVar10;
              bVar5 = tcu::isSRGB(*pTVar21);
              if (bVar5) {
                tcu::linearToSRGB((tcu *)&s,(Vec4 *)&mantissaBits);
                mantissaBits.m_data[1] = iStack_1b4;
                mantissaBits.m_data[0] = _s;
                mantissaBits.m_data._8_8_ = pVStack_1b0;
              }
              tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&s);
              for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                fVar1 = (float)(&format.order)[lVar8];
                fVar24 = (float)mantissaBits.m_data[lVar8];
                *(uint *)(&s + lVar8 * 4) =
                     ~-(uint)(fVar24 < fVar1) & (uint)(fVar24 - fVar1) |
                     (uint)(fVar1 - fVar24) & -(uint)(fVar24 < fVar1);
              }
              tcu::lessThanEqual<float,4>((tcu *)&local_1f8,(Vector<float,_4> *)&s,&threshold);
              tcu::logicalAnd<bool,4>((tcu *)local_238,(Vector<bool,_4> *)&local_1f8,&channelMask);
              bVar5 = tcu::anyNotEqual<bool,4>((Vector<bool,_4> *)local_238,&channelMask);
              if (bVar5) {
                std::__cxx11::stringstream::stringstream((stringstream *)&s);
                poVar9 = std::operator<<(local_1a8,"Ref:");
                poVar9 = tcu::operator<<(poVar9,(Vector<float,_4> *)&mantissaBits);
                poVar9 = std::operator<<(poVar9," Mask:");
                poVar9 = tcu::operator<<(poVar9,&channelMask);
                poVar9 = std::operator<<(poVar9," Threshold:");
                poVar9 = tcu::operator<<(poVar9,&threshold);
                poVar9 = std::operator<<(poVar9," Color:");
                tcu::operator<<(poVar9,(Vector<float,_4> *)&format);
                std::__cxx11::stringbuf::str();
LAB_004ce06d:
                std::__cxx11::string::operator=((string *)&message,(string *)local_238);
                std::__cxx11::string::~string((string *)local_238);
                std::__cxx11::stringstream::~stringstream((stringstream *)&s);
                goto LAB_004ce097;
              }
              break;
            case TEXTURECHANNELCLASS_SIGNED_INTEGER:
              pUVar12 = (UVec4 *)(ulong)uVar23;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&image,iVar18,x,uVar23);
              format = *(TextureFormat *)pVVar17;
              tcu::Vector<int,_4>::Vector(&mantissaBits,1);
              tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&s);
              for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                iVar18 = *(int *)((long)&image.
                                         super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                         .m_data.ptr + lVar8 * 4);
                CVar11 = (&format.order)[lVar8];
                uVar10 = iVar18 - CVar11;
                if (iVar18 - CVar11 == 0 || iVar18 < (int)CVar11) {
                  uVar10 = -(iVar18 - CVar11);
                }
                pUVar12 = (UVec4 *)(ulong)uVar10;
                *(uint *)(&s + lVar8 * 4) = uVar10;
              }
              tcu::lessThanEqual<int,4>((tcu *)&threshold,(Vector<int,_4> *)&s,&mantissaBits);
              tcu::logicalAnd<bool,4>((tcu *)local_238,(Vector<bool,_4> *)&threshold,&channelMask);
              bVar5 = tcu::anyNotEqual<bool,4>((Vector<bool,_4> *)local_238,&channelMask);
              if (bVar5) {
                std::__cxx11::stringstream::stringstream((stringstream *)&s);
                poVar9 = std::operator<<(local_1a8,"Ref:");
                poVar9 = tcu::operator<<(poVar9,(Vector<int,_4> *)&format);
                poVar9 = std::operator<<(poVar9," Mask:");
                poVar9 = tcu::operator<<(poVar9,&channelMask);
                poVar9 = std::operator<<(poVar9," Threshold:");
                poVar9 = tcu::operator<<(poVar9,&mantissaBits);
                poVar9 = std::operator<<(poVar9," Color:");
                tcu::operator<<(poVar9,(Vector<int,_4> *)&image);
                std::__cxx11::stringbuf::str();
                goto LAB_004ce06d;
              }
              break;
            case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
              pUVar12 = (UVec4 *)(ulong)uVar23;
              tcu::ConstPixelBufferAccess::getPixelUint
                        ((ConstPixelBufferAccess *)&image,iVar18,x,uVar23);
              format = *(TextureFormat *)pVVar17;
              tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&mantissaBits,1);
              tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&s);
              for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                CVar11 = (&format.order)[lVar8];
                CVar13 = *(ChannelOrder *)
                          ((long)&image.
                                  super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                  .m_data.ptr + lVar8 * 4);
                uVar10 = CVar11 - CVar13;
                if (CVar11 < CVar13) {
                  uVar10 = -(CVar11 - CVar13);
                }
                pUVar12 = (UVec4 *)(ulong)uVar10;
                *(uint *)(&s + lVar8 * 4) = uVar10;
              }
              tcu::lessThanEqual<unsigned_int,4>
                        ((tcu *)&threshold,(Vector<unsigned_int,_4> *)&s,
                         (Vector<unsigned_int,_4> *)&mantissaBits);
              tcu::logicalAnd<bool,4>((tcu *)local_238,(Vector<bool,_4> *)&threshold,&channelMask);
              bVar5 = tcu::anyNotEqual<bool,4>((Vector<bool,_4> *)local_238,&channelMask);
              if (bVar5) {
                std::__cxx11::stringstream::stringstream((stringstream *)&s);
                poVar9 = std::operator<<(local_1a8,"Ref:");
                poVar9 = tcu::operator<<(poVar9,(Vector<unsigned_int,_4> *)&format);
                poVar9 = std::operator<<(poVar9," Mask:");
                poVar9 = tcu::operator<<(poVar9,&channelMask);
                poVar9 = std::operator<<(poVar9," Threshold:");
                poVar9 = tcu::operator<<(poVar9,(Vector<unsigned_int,_4> *)&mantissaBits);
                poVar9 = std::operator<<(poVar9," Color:");
                tcu::operator<<(poVar9,(Vector<unsigned_int,_4> *)&image);
                std::__cxx11::stringbuf::str();
                goto LAB_004ce06d;
              }
              break;
            case TEXTURECHANNELCLASS_FLOATING_POINT:
              pUVar12 = (UVec4 *)(ulong)uVar23;
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&image,iVar18,x,uVar23);
              format = *(TextureFormat *)pVVar17;
              tcu::getTextureFormatMantissaBitDepth((tcu *)&mantissaBits,&format_1);
              tcu::Vector<int,_4>::Vector(local_238,1);
              tcu::operator*((tcu *)&s,10,local_238);
              tcu::operator-((tcu *)&local_1f8,0x17,&mantissaBits);
              tcu::operator<<((tcu *)&threshold,(Vector<int,_4> *)&s,(Vector<int,_4> *)&local_1f8);
              for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                CVar11 = *(ChannelOrder *)
                          ((long)&image.
                                  super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                                  .m_data.ptr + lVar8 * 4) & 0x7fffffff;
                CVar13 = (&format.order)[lVar8] & 0x7fffffff;
                uVar10 = CVar11 - CVar13;
                if (CVar11 < CVar13) {
                  uVar10 = -(CVar11 - CVar13);
                }
                pUVar12 = (UVec4 *)(ulong)uVar10;
                if (((int)threshold.m_data[lVar8] < (int)uVar10) &&
                   (channelMask.m_data[lVar8] == true)) {
                  local_1f8.m_data[0] = threshold.m_data[0];
                  local_1f8.m_data[1] = threshold.m_data[0];
                  local_1f8.m_data[2] = threshold.m_data[0];
                  local_1f8.m_data[3] = threshold.m_data[0];
                  std::__cxx11::stringstream::stringstream((stringstream *)&s);
                  poVar9 = std::operator<<(local_1a8,"Ref:");
                  poVar9 = tcu::operator<<(poVar9,(Vector<float,_4> *)&format);
                  poVar9 = std::operator<<(poVar9," Mask:");
                  poVar9 = tcu::operator<<(poVar9,&channelMask);
                  poVar9 = std::operator<<(poVar9," Threshold:");
                  poVar9 = tcu::operator<<(poVar9,&local_1f8);
                  poVar9 = std::operator<<(poVar9," Color:");
                  tcu::operator<<(poVar9,(Vector<float,_4> *)&image);
                  std::__cxx11::stringbuf::str();
                  goto LAB_004ce06d;
                }
              }
            }
            x = x + 1;
            VVar27 = VVar3;
          }
        }
      }
      description = local_218;
    }
    std::__cxx11::string::~string((string *)&message);
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::~UniqueBase(&image_2.
                   super_UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                 );
  }
  tcu::TestStatus::pass(__return_storage_ptr__,description);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageClearingTestInstance::verifyResultImage (const std::string& successMessage, const UVec4& clearCoords) const
{
	const bool useClearRange = clearCoords != UVec4();
	DE_ASSERT(!useClearRange || m_params.imageExtent.depth == 1u);

	if (getIsDepthFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_DEPTH_BIT);
		std::string							message;
		float								depthValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				depthValue = m_params.clearValue[0].depthStencil.depth;
			else
				depthValue = m_params.initValue.depthStencil.depth;

			if (!comparePixelToDepthClearValue(image->getLevel(0), x, y, depthValue, message))
				return TestStatus::fail("Depth value mismatch! " + message);
		}
	}

	if (getIsStencilFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_STENCIL_BIT);
		std::string							message;
		deUint32							stencilValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				stencilValue = m_params.clearValue[0].depthStencil.stencil;
			else
				stencilValue = m_params.initValue.depthStencil.stencil;

			if (!comparePixelToStencilClearValue(image->getLevel(0), x, y, stencilValue, message))
				return TestStatus::fail("Stencil value mismatch! " + message);
		}
	}

	if (!isDepthStencilFormat(m_params.imageFormat))
	{
		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_COLOR_BIT);
		std::string							message;
		const VkClearColorValue*			pColorValue;

		for (deUint32 mipLevel = 0; mipLevel < m_imageMipLevels; ++mipLevel)
		{
			const int			clearColorNdx	= (mipLevel < m_thresholdMipLevel ? 0 : 1);
			const VkExtent3D	extent			= getMipLevelExtent(m_params.imageExtent, mipLevel);

			for (deUint32 z = 0; z < extent.depth;  ++z)
			for (deUint32 y = 0; y < extent.height; ++y)
			for (deUint32 x = 0; x < extent.width;  ++x)
			{
				if (!useClearRange || isInClearRange(clearCoords, x, y))
					pColorValue = &m_params.clearValue[clearColorNdx].color;
				else
					pColorValue = &m_params.initValue.color;

				if (!comparePixelToColorClearValue(image->getLevel(mipLevel), x, y, z, *pColorValue, message))
					return TestStatus::fail("Color value mismatch! " + message);
			}
		}
	}

	return TestStatus::pass(successMessage);
}